

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O0

bool prepareAudioOut(TParameters *params)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  uint *in_RDI;
  SDL_AudioSpec obtainedSpec;
  SDL_AudioSpec playbackSpec;
  int i;
  int nDevices;
  uint local_58;
  ushort local_54;
  byte local_52;
  ushort local_50;
  undefined4 local_38;
  undefined2 local_34;
  undefined1 local_32;
  undefined2 local_30;
  code *local_28;
  TPlaybackData *local_20;
  uint local_18;
  uint local_14;
  uint *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  iVar2 = SDL_Init(0x10);
  if (iVar2 < 0) {
    uVar3 = SDL_GetError();
    SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar3);
    local_1 = false;
  }
  else {
    local_14 = SDL_GetNumAudioDevices(0);
    printf("Found %d playback devices:\n",(ulong)local_14);
    for (local_18 = 0; uVar1 = local_18, (int)local_18 < (int)local_14; local_18 = local_18 + 1) {
      uVar3 = SDL_GetAudioDeviceName(local_18,0);
      printf("    - Playback device #%d: \'%s\'\n",(ulong)uVar1,uVar3);
    }
    if (((int)*local_10 < 0) || ((int)local_14 <= (int)*local_10)) {
      printf("Invalid playback device id selected - %d\n",(ulong)*local_10);
      local_1 = false;
    }
    else {
      SDL_memset(&local_38,0,0x20);
      local_38 = 16000;
      local_34 = 0x8010;
      local_32 = 1;
      local_30 = 0x400;
      local_28 = cbPlayback<short>;
      local_20 = &g_playbackData;
      SDL_memset(&local_58,0,0x20);
      uVar3 = SDL_GetAudioDeviceName(*local_10,0);
      g_deviceIdOut = SDL_OpenAudioDevice(uVar3,0,&local_38,&local_58);
      if (g_deviceIdOut == 0) {
        uVar3 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t open an audio device for playback: %s!\n",uVar3);
        SDL_Quit();
        local_1 = false;
      }
      else {
        printf("Opened playback device succesfully!\n");
        printf("    Frequency:  %d\n",(ulong)local_58);
        printf("    Format:     %d\n",(ulong)local_54);
        printf("    Channels:   %d\n",(ulong)local_52);
        printf("    Samples:    %d\n",(ulong)local_50);
        SDL_PauseAudioDevice(g_deviceIdOut,1);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool prepareAudioOut(const TParameters & params) {
    if (SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return false;
    }

    int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
    printf("Found %d playback devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
    }

    if (params.playbackId < 0 || params.playbackId >= nDevices) {
        printf("Invalid playback device id selected - %d\n", params.playbackId);
        return false;
    }

    SDL_AudioSpec playbackSpec;
    SDL_zero(playbackSpec);

    playbackSpec.freq = kSampleRate;
    playbackSpec.format = std::is_same<TSample, int16_t>::value ? AUDIO_S16 : AUDIO_S32;
    playbackSpec.channels = 1;
    playbackSpec.samples = TPlaybackData::kSamples;
    playbackSpec.callback = cbPlayback<TSample>;
    playbackSpec.userdata = &g_playbackData;

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    g_deviceIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(params.playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &obtainedSpec, 0);
    if (!g_deviceIdOut) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for playback: %s!\n", SDL_GetError());
        SDL_Quit();
        return false;
    }

    printf("Opened playback device succesfully!\n");
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d\n", obtainedSpec.format);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    SDL_PauseAudioDevice(g_deviceIdOut, 1);

    return true;
}